

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

bool __thiscall VkSpecParser::parse(VkSpecParser *this)

{
  byte bVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  ulong uVar3;
  char *pcVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  char16_t *str;
  char16_t *str_1;
  DataPointer *in_stack_fffffffffffffea8;
  enum_type in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  byte in_stack_fffffffffffffeb6;
  byte in_stack_fffffffffffffeb7;
  undefined4 in_stack_fffffffffffffec0;
  QString *this_00;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  bool bVar6;
  QArrayDataPointer<char16_t> local_f8 [2];
  undefined1 local_b8 [16];
  QArrayDataPointer<char16_t> local_a8 [2];
  undefined1 local_68 [16];
  QString local_58 [2];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QFile::setFileName((QString *)in_RDI);
  QVar2.i = (Int)operator|(CONCAT13(in_stack_fffffffffffffeb7,
                                    CONCAT12(in_stack_fffffffffffffeb6,
                                             CONCAT11(in_stack_fffffffffffffeb5,
                                                      in_stack_fffffffffffffeb4))),
                           in_stack_fffffffffffffeb0);
  uVar3 = QFile::open((QFlags *)in_RDI);
  if ((uVar3 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(QVar2.i,in_stack_fffffffffffffec0),(char *)in_RDI,
               CONCAT13(in_stack_fffffffffffffeb7,
                        CONCAT12(in_stack_fffffffffffffeb6,
                                 CONCAT11(in_stack_fffffffffffffeb5,in_stack_fffffffffffffeb4))),
               (char *)in_stack_fffffffffffffea8);
    QFile::fileName();
    QtPrivate::asString(local_58);
    QString::toLocal8Bit(this_00);
    pcVar4 = QByteArray::constData((QByteArray *)0x102d22);
    QMessageLogger::warning(local_28,"Failed to open %s",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x102d48);
    QString::~QString((QString *)0x102d55);
    bVar6 = false;
  }
  else {
    QXmlStreamReader::setDevice((QIODevice *)&(in_RDI->d).size);
    QList<VkSpecParser::Command>::clear
              ((QList<VkSpecParser::Command> *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT15(in_stack_fffffffffffffeb5,
                                          CONCAT14(in_stack_fffffffffffffeb4,
                                                   in_stack_fffffffffffffeb0)))));
    QMap<QString,_QList<QString>_>::clear
              ((QMap<QString,_QList<QString>_> *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT15(in_stack_fffffffffffffeb5,
                                          CONCAT14(in_stack_fffffffffffffeb4,
                                                   in_stack_fffffffffffffeb0)))));
    while( true ) {
      bVar1 = QXmlStreamReader::atEnd();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      QXmlStreamReader::readNext();
      bVar6 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x102dc1);
      if (bVar6) {
        auVar5 = QXmlStreamReader::name();
        local_68 = auVar5;
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_a8,(Data *)0x0,L"commands",8);
        QString::QString((QString *)
                         CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(in_stack_fffffffffffffeb6,
                                           CONCAT15(in_stack_fffffffffffffeb5,
                                                    CONCAT14(in_stack_fffffffffffffeb4,
                                                             in_stack_fffffffffffffeb0)))),
                         in_stack_fffffffffffffea8);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT44(QVar2.i,in_stack_fffffffffffffec0),in_RDI);
        in_stack_fffffffffffffeb7 =
             operator==((QStringView *)
                        CONCAT17(in_stack_fffffffffffffeb7,
                                 CONCAT16(in_stack_fffffffffffffeb6,
                                          CONCAT15(in_stack_fffffffffffffeb5,
                                                   CONCAT14(in_stack_fffffffffffffeb4,
                                                            in_stack_fffffffffffffeb0)))),
                        (QStringView *)in_stack_fffffffffffffea8);
        QString::~QString((QString *)0x102e76);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)
                   CONCAT17(in_stack_fffffffffffffeb7,
                            CONCAT16(in_stack_fffffffffffffeb6,
                                     CONCAT15(in_stack_fffffffffffffeb5,
                                              CONCAT14(in_stack_fffffffffffffeb4,
                                                       in_stack_fffffffffffffeb0)))));
        if ((in_stack_fffffffffffffeb7 & 1) == 0) {
          auVar5 = QXmlStreamReader::name();
          local_b8 = auVar5;
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_f8,(Data *)0x0,L"feature",7);
          QString::QString((QString *)
                           CONCAT17(in_stack_fffffffffffffeb7,
                                    CONCAT16(in_stack_fffffffffffffeb6,
                                             CONCAT15(in_stack_fffffffffffffeb5,
                                                      CONCAT14(in_stack_fffffffffffffeb4,
                                                               in_stack_fffffffffffffeb0)))),
                           in_stack_fffffffffffffea8);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)CONCAT44(QVar2.i,in_stack_fffffffffffffec0),in_RDI);
          in_stack_fffffffffffffeb6 =
               operator==((QStringView *)
                          CONCAT17(in_stack_fffffffffffffeb7,
                                   CONCAT16(in_stack_fffffffffffffeb6,
                                            CONCAT15(in_stack_fffffffffffffeb5,
                                                     CONCAT14(in_stack_fffffffffffffeb4,
                                                              in_stack_fffffffffffffeb0)))),
                          (QStringView *)in_stack_fffffffffffffea8);
          QString::~QString((QString *)0x102f36);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)
                     CONCAT17(in_stack_fffffffffffffeb7,
                              CONCAT16(in_stack_fffffffffffffeb6,
                                       CONCAT15(in_stack_fffffffffffffeb5,
                                                CONCAT14(in_stack_fffffffffffffeb4,
                                                         in_stack_fffffffffffffeb0)))));
          if ((in_stack_fffffffffffffeb6 & 1) != 0) {
            parseFeature((VkSpecParser *)
                         CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
          }
        }
        else {
          parseCommands((VkSpecParser *)CONCAT44(QVar2.i,in_stack_fffffffffffffec0));
        }
      }
    }
    bVar6 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool VkSpecParser::parse()
{
    m_file.setFileName(m_fn);
    if (!m_file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        qWarning("Failed to open %s", qPrintable(m_file.fileName()));
        return false;
    }
    m_reader.setDevice(&m_file);

    m_commands.clear();
    m_versionCommandMapping.clear();

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("commands"))
                parseCommands();
            else if (m_reader.name() == QStringLiteral("feature"))
                parseFeature();
        }
    }

    return true;
}